

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderScoreHud(CHud *this)

{
  ulong uVar1;
  uint uVar2;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar3;
  long lVar4;
  CNetObj_GameDataTeam *pCVar5;
  long lVar6;
  CNetObj_GameDataRace *pCVar7;
  ITextRender *pIVar8;
  CNetObj_GameDataFlag *pCVar9;
  IClient *pIVar10;
  IGraphics *pIVar11;
  vec2 vVar12;
  vec2 CursorPosition;
  vec2 Pos;
  vec2 CursorPosition_00;
  vec2 Pos_00;
  undefined4 uVar13;
  int iVar14;
  int iVar15;
  CAnimState *pCVar16;
  CClientData *pCVar17;
  CPlayerInfoItem *pCVar18;
  int64 StringVersion;
  CGameClient *pCVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  int t;
  CTextCursor *pCVar25;
  long lVar26;
  long in_FS_OFFSET;
  bool bVar27;
  float extraout_XMM0_Da;
  float fVar28;
  float fVar29;
  undefined4 uVar30;
  float fVar31;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar32;
  float fVar33;
  float extraout_XMM0_Da_00;
  float fVar34;
  float fVar35;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar36;
  uint uVar37;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar38;
  float local_22c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_220;
  float local_214;
  float local_210;
  float local_1b8;
  vec4 local_1a8;
  CUIRect Rect;
  char aBuf [32];
  char aBuf_1 [32];
  CPlayerInfoItem aPlayerInfo [2];
  undefined8 local_80;
  char aName [64];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar19 = (this->super_CComponent).m_pClient;
  if ((((pCVar19->m_Snap).m_pGameData)->m_GameStateFlags & 0xc) == 0) {
    uVar2 = (pCVar19->m_GameInfo).m_GameFlags;
    fVar34 = ((float)pCVar19->m_pGraphics->m_ScreenWidth /
             (float)pCVar19->m_pGraphics->m_ScreenHeight) * 300.0;
    if ((((uVar2 & 1) == 0) || ((uVar2 & 8) != 0)) ||
       ((pCVar19->m_Snap).m_pGameDataTeam == (CNetObj_GameDataTeam *)0x0)) {
      uVar37 = 0xffffffff;
      local_80 = 0x200000001;
      aPlayerInfo[1].m_pPlayerInfo = (CNetObj_PlayerInfo *)0x0;
      aPlayerInfo[1].m_ClientID = 0;
      aPlayerInfo[1]._12_4_ = 0;
      aPlayerInfo[0].m_pPlayerInfo = (CNetObj_PlayerInfo *)0x0;
      aPlayerInfo[0].m_ClientID = 0;
      aPlayerInfo[0]._12_4_ = 0;
      pCVar18 = (pCVar19->m_Snap).m_aInfoByScore;
      uVar22 = 0;
      uVar21 = 0xffffffffffffffff;
      while( true ) {
        uVar1 = uVar21 + 1;
        bVar27 = uVar1 < 0x40;
        if ((1 < (int)uVar22) || (0x3f < uVar1)) goto LAB_0013a5fd;
        if (pCVar18->m_pPlayerInfo == (CNetObj_PlayerInfo *)0x0) break;
        if (pCVar19->m_aClients[pCVar18->m_ClientID].m_Team != -1) {
          uVar30 = *(undefined4 *)((long)&pCVar18->m_pPlayerInfo + 4);
          iVar14 = pCVar18->m_ClientID;
          uVar13 = *(undefined4 *)&pCVar18->field_0xc;
          *(undefined4 *)&aPlayerInfo[(int)uVar22].m_pPlayerInfo =
               *(undefined4 *)&pCVar18->m_pPlayerInfo;
          *(undefined4 *)((long)&aPlayerInfo[(int)uVar22].m_pPlayerInfo + 4) = uVar30;
          aPlayerInfo[(int)uVar22].m_ClientID = iVar14;
          *(undefined4 *)&aPlayerInfo[(int)uVar22].field_0xc = uVar13;
          if (aPlayerInfo[(int)uVar22].m_ClientID == pCVar19->m_LocalClientID) {
            uVar37 = uVar22;
          }
          uVar22 = uVar22 + 1;
        }
        pCVar18 = pCVar18 + 1;
        uVar21 = uVar1;
      }
      bVar27 = true;
LAB_0013a5fd:
      if (uVar37 == 0xffffffff) {
        iVar14 = pCVar19->m_LocalClientID;
        uVar37 = 0xffffffff;
        if (((long)iVar14 != -1) && ((bool)(pCVar19->m_aClients[iVar14].m_Team != -1 & bVar27))) {
          iVar23 = 2;
          do {
            if (pCVar18->m_pPlayerInfo == (CNetObj_PlayerInfo *)0x0) break;
            iVar23 = iVar23 + (uint)(pCVar19->m_aClients[pCVar18->m_ClientID].m_Team != -1);
            if (pCVar18->m_ClientID == iVar14) {
              local_80 = CONCAT44(iVar23,1);
              aPlayerInfo[1].m_pPlayerInfo = pCVar18->m_pPlayerInfo;
              aPlayerInfo[1].m_ClientID = pCVar18->m_ClientID;
              aPlayerInfo[1]._12_4_ = *(undefined4 *)&pCVar18->field_0xc;
              uVar37 = 1;
              goto LAB_0013a606;
            }
            uVar21 = uVar21 + 1;
            pCVar18 = pCVar18 + 1;
          } while (uVar21 < 0x3f);
          local_80 = CONCAT44(iVar23,1);
        }
      }
LAB_0013a606:
      if ((RenderScoreHud()::s_ScoreCursors == '\0') &&
         (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_ScoreCursors), iVar14 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_ScoreCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_ScoreCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor_15,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_ScoreCursors);
      }
      if ((RenderScoreHud()::s_PositionCursors == '\0') &&
         (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_PositionCursors), iVar14 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_PositionCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_PositionCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor_16,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PositionCursors);
      }
      uVar30 = *(undefined4 *)(&DAT_001c9a24 + (ulong)((uVar2 & 8) == 0) * 4);
      lVar26 = 0;
      for (lVar24 = 0; lVar24 != 0xd0; lVar24 = lVar24 + 0x68) {
        *(undefined4 *)((long)&RenderScoreHud::s_ScoreCursors[0].m_FontSize + lVar24) = uVar30;
        lVar6 = *(long *)((long)&aPlayerInfo[0].m_pPlayerInfo + lVar26 * 4);
        if (lVar6 == 0) {
          aBuf._0_8_ = aBuf._0_8_ & 0xffffffffffffff00;
          StringVersion = -1;
        }
        else {
          if ((uVar2 & 8) == 0) {
            str_format(aBuf,0x20,"%d");
          }
          else {
            pCVar7 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
            iVar14 = 3;
            if (pCVar7 != (CNetObj_GameDataRace *)0x0) {
              iVar14 = pCVar7->m_Precision;
            }
            FormatTime(aBuf,0x20,*(int *)(lVar6 + 4),iVar14);
          }
          StringVersion = (int64)*(int *)(lVar6 + 4);
        }
        pCVar25 = (CTextCursor *)((long)&RenderScoreHud::s_ScoreCursors[0].m_Width + lVar24);
        CTextCursor::Reset(pCVar25,StringVersion);
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[7])(pIVar8,pCVar25,aBuf,0xffffffff);
        pCVar25 = (CTextCursor *)((long)&RenderScoreHud::s_PositionCursors[0].m_Width + lVar24);
        CTextCursor::Reset(pCVar25,0);
        str_format(aBuf,0x20,"%d.",(ulong)*(uint *)(aName + lVar26 + -8));
        *(undefined4 *)((long)&RenderScoreHud::s_PositionCursors[0].m_FontSize + lVar24) =
             0x41200000;
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[7])(pIVar8,pCVar25,aBuf,0xffffffff);
        lVar26 = lVar26 + 4;
      }
      fVar33 = RenderScoreHud::s_ScoreCursors[0].m_Width;
      if (RenderScoreHud::s_ScoreCursors[0].m_Width <= RenderScoreHud::s_ScoreCursors[1].m_Width) {
        fVar33 = RenderScoreHud::s_ScoreCursors[1].m_Width;
      }
      pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar8->super_IInterface)._vptr_IInterface[6])(uVar30,pIVar8,"10",0xffffffffffffffff);
      if (fVar33 <= extraout_XMM0_Da) {
        fVar33 = extraout_XMM0_Da;
      }
      if ((uVar2 & 4) == 0) {
        local_214 = (fVar34 - fVar33) + -16.0;
        local_220.x = local_214 + -6.0;
      }
      else {
        if ((RenderScoreHud()::s_PlayerCountCursor == '\0') &&
           (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursor), iVar14 != 0)) {
          CTextCursor::CTextCursor(&RenderScoreHud::s_PlayerCountCursor,8.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_PlayerCountCursor,&__dso_handle)
          ;
          __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursor);
        }
        pcVar20 = "%d players left";
        if ((((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0] == 1) {
          pcVar20 = "%d player left";
        }
        pcVar20 = Localize(pcVar20,"");
        str_format(aBuf_1,0x20,pcVar20,
                   (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0]);
        CTextCursor::Reset(&RenderScoreHud::s_PlayerCountCursor,
                           (long)(g_Localization.m_CurrentVersion << 8 |
                                 (((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0]));
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[7])
                  (pIVar8,&RenderScoreHud::s_PlayerCountCursor,aBuf_1,0xffffffff);
        RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x =
             (fVar34 - RenderScoreHud::s_PlayerCountCursor.m_Width) + -1.0;
        local_214 = (fVar34 - fVar33) + -16.0;
        local_220.x = local_214 + -6.0;
        if (local_220.x <= RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x) {
          RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x = local_220.x;
        }
        RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_1.y = 217.0;
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar8,&RenderScoreHud::s_PlayerCountCursor,0,0xffffffff);
      }
      local_210 = fVar34 - fVar33;
      local_1b8 = 0.0;
      if ((uVar2 & 8) != 0) {
        local_1b8 = 2.0;
      }
      local_220.x = local_220.x + -16.0;
      fVar35 = 229.0;
      for (uVar21 = 0; uVar21 != 2; uVar21 = uVar21 + 1) {
        fVar28 = (float)(int)uVar21;
        fVar29 = fVar28 * 20.0 + fVar35;
        Rect.h = 18.0;
        Rect.x = local_220.x;
        Rect.y = fVar29;
        Rect.w = fVar33 + 16.0 + 6.0 + 16.0;
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                  ();
        uVar30 = 0x3f800000;
        if (uVar21 != uVar37) {
          uVar30 = 0;
        }
        aBuf_1[4] = (char)uVar30;
        aBuf_1[5] = (char)((uint)uVar30 >> 8);
        aBuf_1[6] = (char)((uint)uVar30 >> 0x10);
        aBuf_1[7] = (char)((uint)uVar30 >> 0x18);
        aBuf_1[0] = (char)uVar30;
        aBuf_1[1] = (char)((uint)uVar30 >> 8);
        aBuf_1[2] = (char)((uint)uVar30 >> 0x10);
        aBuf_1[3] = (char)((uint)uVar30 >> 0x18);
        aBuf_1[0xc] = '\0';
        aBuf_1[0xd] = '\0';
        aBuf_1[0xe] = -0x80;
        aBuf_1[0xf] = '>';
        aBuf_1[8] = (char)uVar30;
        aBuf_1[9] = (char)((uint)uVar30 >> 8);
        aBuf_1[10] = (char)((uint)uVar30 >> 0x10);
        aBuf_1[0xb] = (char)((uint)uVar30 >> 0x18);
        CUIRect::Draw(&Rect,(vec4 *)aBuf_1,5.0,5);
        vVar12.field_1.y = fVar29 + local_1b8;
        vVar12.field_0.x =
             (fVar33 - RenderScoreHud::s_ScoreCursors[uVar21].m_Width) * 0.5 + local_210 + -3.0;
        RenderScoreHud::s_ScoreCursors[uVar21].m_CursorPos = vVar12;
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar8,RenderScoreHud::s_ScoreCursors + uVar21,0,0xffffffffffffffff);
        if (aPlayerInfo[uVar21].m_pPlayerInfo != (CNetObj_PlayerInfo *)0x0) {
          if ((RenderScoreHud()::s_NameCursor == '\0') &&
             (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_NameCursor), iVar14 != 0)) {
            CTextCursor::CTextCursor(&RenderScoreHud::s_NameCursor,8.0,0);
            __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_NameCursor,&__dso_handle);
            __cxa_guard_release(&RenderScoreHud()::s_NameCursor);
          }
          CTextCursor::Reset(&RenderScoreHud::s_NameCursor,-1);
          iVar14 = aPlayerInfo[uVar21].m_ClientID;
          pCVar19 = (this->super_CComponent).m_pClient;
          pCVar17 = pCVar19->m_aClients + iVar14;
          if (pCVar19->m_pConfig->m_ClShowsocial == 0) {
            pCVar17 = (CClientData *)0x1d1174;
          }
          str_format(aName,0x40,"%s",pCVar17);
          pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar8->super_IInterface)._vptr_IInterface[7])
                    (pIVar8,&RenderScoreHud::s_NameCursor,aName,0xffffffff);
          fVar29 = RenderScoreHud::s_NameCursor.m_Width;
          fVar31 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,8.0);
          aVar36.x = (fVar34 - (fVar31 + fVar29)) + -1.0;
          if (local_220.x <= aVar36.x) {
            aVar36.x = local_220.x;
          }
          aVar38.y = (float)((int)uVar21 + 1) * 20.0 + fVar35 + -3.0;
          aBuf_1[0] = '\0';
          aBuf_1[1] = '\0';
          aBuf_1[2] = -0x80;
          aBuf_1[3] = '?';
          aBuf_1[4] = '\0';
          aBuf_1[5] = '\0';
          aBuf_1[6] = -0x80;
          aBuf_1[7] = '?';
          aBuf_1[8] = '\0';
          aBuf_1[9] = '\0';
          aBuf_1[10] = -0x80;
          aBuf_1[0xb] = '?';
          aBuf_1[0xc] = '\0';
          aBuf_1[0xd] = '\0';
          aBuf_1[0xe] = '\0';
          aBuf_1[0xf] = '?';
          local_1a8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
          local_1a8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
          local_1a8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
          local_1a8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
          CursorPosition_00.field_1 = aVar38;
          CursorPosition_00.field_0.x = aVar36.x;
          fVar29 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                     RenderScoreHud::s_NameCursor.m_FontSize,CursorPosition_00,
                                     iVar14,(vec4 *)aBuf_1,&local_1a8);
          RenderScoreHud::s_NameCursor.m_CursorPos.field_0.x = fVar29 + aVar36.x;
          pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          RenderScoreHud::s_NameCursor.m_CursorPos.field_1.y = aVar38.y;
          (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar8,&RenderScoreHud::s_NameCursor,0);
          pCVar19 = (this->super_CComponent).m_pClient;
          memcpy((CTeeRenderInfo *)aBuf_1,&pCVar19->m_aClients[iVar14].m_RenderInfo,0x9c);
          pCVar16 = CAnimState::GetIdle();
          Pos_00.field_1.y = fVar28 * 20.0 + fVar35 + 1.0 + 9.0;
          Pos_00.field_0.x = (local_210 - 9.0) + -3.0;
          CRenderTools::RenderTee
                    (&pCVar19->m_RenderTools,pCVar16,(CTeeRenderInfo *)aBuf_1,0,(vec2)0x3f800000,
                     Pos_00);
        }
        RenderScoreHud::s_PositionCursors[uVar21].m_CursorPos.field_0.x = local_214 + -3.0 + -16.0;
        RenderScoreHud::s_PositionCursors[uVar21].m_CursorPos.field_1.y =
             fVar28 * 20.0 + fVar35 + 2.0;
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar8,RenderScoreHud::s_PositionCursors + uVar21,0,0xffffffffffffffff
                  );
        fVar35 = fVar35 + 8.0;
      }
    }
    else {
      if ((RenderScoreHud()::s_ExpectedScoreWidth == '\0') &&
         (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_ExpectedScoreWidth), iVar14 != 0)) {
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[6])
                  (0x41600000,pIVar8,"100",0xffffffffffffffff);
        RenderScoreHud::s_ExpectedScoreWidth = extraout_XMM0_Da_00;
        __cxa_guard_release(&RenderScoreHud()::s_ExpectedScoreWidth);
      }
      if ((RenderScoreHud()::s_TeamscoreCursors == '\0') &&
         (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_TeamscoreCursors), iVar14 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_TeamscoreCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_TeamscoreCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_TeamscoreCursors);
      }
      if ((RenderScoreHud()::s_PlayerCountCursors == '\0') &&
         (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursors), iVar14 != 0)) {
        CTextCursor::CTextCursor(RenderScoreHud::s_PlayerCountCursors);
        CTextCursor::CTextCursor(RenderScoreHud::s_PlayerCountCursors + 1);
        __cxa_atexit(__cxx_global_array_dtor_11,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursors);
      }
      pCVar5 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataTeam;
      Rect.x = (float)pCVar5->m_TeamscoreRed;
      fVar33 = (float)pCVar5->m_TeamscoreBlue;
      pcVar20 = aName;
      Rect.y = fVar33;
      str_format(pcVar20,0x20,"%d");
      str_format(aName + 0x20,0x20,"%d",(ulong)(uint)fVar33);
      pCVar25 = RenderScoreHud::s_TeamscoreCursors;
      for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
        pCVar25->m_FontSize = 14.0;
        CTextCursor::Reset(pCVar25,(long)*(int *)(aBuf + lVar24 * 4 + -0x10));
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[7])(pIVar8,pCVar25,pcVar20,0xffffffff);
        pcVar20 = pcVar20 + 0x20;
        pCVar25 = pCVar25 + 1;
      }
      fVar33 = RenderScoreHud::s_TeamscoreCursors[0].m_Width;
      if (RenderScoreHud::s_TeamscoreCursors[0].m_Width <=
          RenderScoreHud::s_TeamscoreCursors[1].m_Width) {
        fVar33 = RenderScoreHud::s_TeamscoreCursors[1].m_Width;
      }
      if (fVar33 <= RenderScoreHud::s_ExpectedScoreWidth) {
        fVar33 = RenderScoreHud::s_ExpectedScoreWidth;
      }
      fVar35 = *(float *)(&DAT_001c9a1c + (ulong)((uVar2 & 2) == 0) * 4);
      fVar28 = fVar34 - fVar33;
      aVar36.x = (fVar28 - fVar35) + -6.0;
      fVar29 = 229.0;
      for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
        fVar31 = (float)(int)lVar24 * 20.0 + fVar29;
        aPlayerInfo[0].m_pPlayerInfo = (CNetObj_PlayerInfo *)CONCAT44(fVar31,aVar36);
        aPlayerInfo[0]._12_4_ = 0x41900000;
        aPlayerInfo[0].m_ClientID = (int)(fVar35 + fVar33 + 6.0);
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                  ();
        uVar30 = 0;
        if (lVar24 == 0) {
          uVar37 = 0x3f800000;
        }
        else {
          uVar37 = 0;
          uVar30 = 0x3f800000;
        }
        aBuf_1[4] = '\0';
        aBuf_1[5] = '\0';
        aBuf_1[6] = '\0';
        aBuf_1[7] = '\0';
        aBuf_1[0] = (char)uVar37;
        aBuf_1[1] = (char)(uVar37 >> 8);
        aBuf_1[2] = (char)(uVar37 >> 0x10);
        aBuf_1[3] = (char)(uVar37 >> 0x18);
        aBuf_1[0xc] = '\0';
        aBuf_1[0xd] = '\0';
        aBuf_1[0xe] = -0x80;
        aBuf_1[0xf] = '>';
        aBuf_1[8] = (char)uVar30;
        aBuf_1[9] = (char)((uint)uVar30 >> 8);
        aBuf_1[10] = (char)((uint)uVar30 >> 0x10);
        aBuf_1[0xb] = (char)((uint)uVar30 >> 0x18);
        CUIRect::Draw((CUIRect *)aPlayerInfo,(vec4 *)aBuf_1,5.0,5);
        RenderScoreHud::s_TeamscoreCursors[lVar24].m_CursorPos.field_0.x =
             (fVar33 - RenderScoreHud::s_TeamscoreCursors[lVar24].m_Width) * 0.5 + fVar28 + -3.0;
        RenderScoreHud::s_TeamscoreCursors[lVar24].m_CursorPos.field_1.y = fVar31;
        pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar8,RenderScoreHud::s_TeamscoreCursors + lVar24,0,
                   0xffffffffffffffff);
        if ((uVar2 & 4) != 0) {
          RenderScoreHud::s_PlayerCountCursors[lVar24].m_FontSize = 8.0;
          pcVar20 = "%d player left";
          if ((((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[lVar24] != 1) {
            pcVar20 = "%d players left";
          }
          pCVar25 = RenderScoreHud::s_PlayerCountCursors + lVar24;
          pcVar20 = Localize(pcVar20,"");
          str_format(aBuf_1,0x20,pcVar20,
                     (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount
                                  [lVar24]);
          CTextCursor::Reset(pCVar25,(long)(g_Localization.m_CurrentVersion << 8 |
                                           (((this->super_CComponent).m_pClient)->m_Snap).
                                           m_AliveCount[lVar24]));
          pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar8->super_IInterface)._vptr_IInterface[7])(pIVar8,pCVar25,aBuf_1,0xffffffff);
          aVar32.x = (fVar34 - RenderScoreHud::s_PlayerCountCursors[lVar24].m_Width) + -1.0;
          if (aVar36.x <= aVar32.x) {
            aVar32.x = aVar36.x;
          }
          RenderScoreHud::s_PlayerCountCursors[lVar24].m_CursorPos.field_0.x = (float)aVar32;
          RenderScoreHud::s_PlayerCountCursors[lVar24].m_CursorPos.field_1.y =
               (float)((int)lVar24 + 1) * 20.0 + fVar29 + -3.0;
          pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar8,pCVar25,0,0xffffffff);
        }
        fVar29 = fVar29 + 8.0;
      }
      if (((uVar2 & 2) != 0) &&
         (pCVar9 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataFlag,
         pCVar9 != (CNetObj_GameDataFlag *)0x0)) {
        local_1a8.field_0 =
             (anon_union_4_2_94730227_for_vector4_base<float>_1)pCVar9->m_FlagCarrierRed;
        local_1a8.field_1 =
             (anon_union_4_2_947300d3_for_vector4_base<float>_3)pCVar9->m_FlagCarrierBlue;
        local_80._0_4_ = pCVar9->m_FlagDropTickRed;
        local_80._4_4_ = pCVar9->m_FlagDropTickBlue;
        local_22c = 229.0;
        lVar24 = 0;
        while( true ) {
          iVar14 = 0x14;
          if (lVar24 == 2) break;
          uVar2 = *(uint *)(aName + lVar24 * 4 + -8);
          uVar21 = (ulong)uVar2;
          if (uVar2 != 0) {
            pIVar10 = ((this->super_CComponent).m_pClient)->m_pClient;
            iVar15 = pIVar10->m_CurGameTick - uVar2;
            iVar23 = pIVar10->m_GameTickSpeed;
            uVar21 = (long)iVar15 % (long)iVar23 & 0xffffffff;
            iVar14 = 0x14;
            if (0x18 < iVar15 / iVar23) {
              iVar14 = 10;
            }
          }
          aVar3 = (&local_1a8.field_0)[lVar24];
          iVar23 = (int)lVar24;
          if (aVar3 == (anon_union_4_2_94730227_for_vector4_base<float>_1)0xffffffff) {
            pCVar19 = (this->super_CComponent).m_pClient;
            lVar26 = (long)pCVar19->m_pClient->m_CurGameTick;
            uVar21 = lVar26 % (long)iVar14 & 0xffffffff;
            if ((lVar26 / (long)iVar14 & 1U) != 0) goto LAB_0013b2c5;
          }
          else if (aVar3 == (anon_union_4_2_94730227_for_vector4_base<float>_1)0xfffffffe) {
            pCVar19 = (this->super_CComponent).m_pClient;
LAB_0013b2c5:
            (*(pCVar19->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                      (pCVar19->m_pGraphics,pCVar19,uVar21);
            pIVar11 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar11->super_IInterface)._vptr_IInterface[0x13])
                      (pIVar11,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
            (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
              [0x17])();
            CRenderTools::SelectSprite
                      (&((this->super_CComponent).m_pClient)->m_RenderTools,(lVar24 == 0) + 0x3f,0,0
                       ,0);
            aBuf_1._4_4_ = (float)iVar23 * 20.0 + local_22c + 1.0;
            aBuf_1._0_4_ = fVar28 - fVar35;
            aBuf_1._12_4_ = fVar35;
            aBuf_1[8] = '\0';
            aBuf_1[9] = '\0';
            aBuf_1[10] = '\0';
            aBuf_1[0xb] = 'A';
            pIVar11 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar11->super_IInterface)._vptr_IInterface[0x1d])(pIVar11,aBuf_1,1);
            (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
              [0x18])();
          }
          else if (-1 < (int)aVar3) {
            if ((RenderScoreHud()::s_CarrierCursor == '\0') &&
               (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_CarrierCursor), iVar14 != 0)) {
              CTextCursor::CTextCursor(&RenderScoreHud::s_CarrierCursor,8.0,0);
              __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_CarrierCursor,&__dso_handle)
              ;
              __cxa_guard_release(&RenderScoreHud()::s_CarrierCursor);
            }
            CTextCursor::Reset(&RenderScoreHud::s_CarrierCursor,-1);
            iVar14 = (int)(&local_1a8.field_0)[lVar24] % 0x40;
            pCVar19 = (this->super_CComponent).m_pClient;
            pCVar17 = pCVar19->m_aClients + iVar14;
            if (pCVar19->m_pConfig->m_ClShowsocial == 0) {
              pCVar17 = (CClientData *)0x1d1174;
            }
            str_format((char *)aPlayerInfo,0x40,"%s",pCVar17);
            pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
            (*(pIVar8->super_IInterface)._vptr_IInterface[7])
                      (pIVar8,&RenderScoreHud::s_CarrierCursor,aPlayerInfo,0xffffffffffffffff);
            fVar33 = RenderScoreHud::s_CarrierCursor.m_Width;
            fVar29 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,8.0);
            aVar32.x = (fVar34 - (fVar29 + fVar33)) + -1.0;
            if (aVar36.x <= aVar32.x) {
              aVar32.x = aVar36.x;
            }
            aVar38.y = (float)(iVar23 + 1) * 20.0 + local_22c + -3.0;
            aBuf_1[0] = '\0';
            aBuf_1[1] = '\0';
            aBuf_1[2] = -0x80;
            aBuf_1[3] = '?';
            aBuf_1[4] = '\0';
            aBuf_1[5] = '\0';
            aBuf_1[6] = -0x80;
            aBuf_1[7] = '?';
            aBuf_1[8] = '\0';
            aBuf_1[9] = '\0';
            aBuf_1[10] = -0x80;
            aBuf_1[0xb] = '?';
            aBuf_1[0xc] = '\0';
            aBuf_1[0xd] = '\0';
            aBuf_1[0xe] = '\0';
            aBuf_1[0xf] = '?';
            aBuf[0] = -0x33;
            aBuf[1] = -0x34;
            aBuf[2] = -0x34;
            aBuf[3] = '=';
            aBuf[4] = -0x33;
            aBuf[5] = -0x34;
            aBuf[6] = -0x34;
            aBuf[7] = '=';
            aBuf[8] = -0x33;
            aBuf[9] = -0x34;
            aBuf[10] = -0x34;
            aBuf[0xb] = '=';
            aBuf[0xc] = '\0';
            aBuf[0xd] = '\0';
            aBuf[0xe] = -0x80;
            aBuf[0xf] = '?';
            CursorPosition.field_1 = aVar38;
            CursorPosition.field_0.x = aVar32.x;
            fVar33 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                       RenderScoreHud::s_CarrierCursor.m_FontSize,CursorPosition,
                                       iVar14,(vec4 *)aBuf_1,(vec4 *)aBuf);
            RenderScoreHud::s_CarrierCursor.m_CursorPos.field_0.x = fVar33 + aVar32.x;
            pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
            RenderScoreHud::s_CarrierCursor.m_CursorPos.field_1.y = aVar38.y;
            (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                      (0x3f800000,pIVar8,&RenderScoreHud::s_CarrierCursor,0);
            pCVar19 = (this->super_CComponent).m_pClient;
            memcpy((CTeeRenderInfo *)aBuf_1,&pCVar19->m_aClients[iVar14].m_RenderInfo,0x9c);
            pCVar16 = CAnimState::GetIdle();
            Pos.field_1.y = (float)iVar23 * 20.0 + local_22c + 1.0 + 9.0;
            Pos.field_0.x = (fVar28 - 9.0) + -3.0;
            CRenderTools::RenderTee
                      (&pCVar19->m_RenderTools,pCVar16,(CTeeRenderInfo *)aBuf_1,0,(vec2)0x3f800000,
                       Pos);
          }
          local_22c = local_22c + 8.0;
          lVar24 = lVar24 + 1;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderScoreHud()
{
	// render small score hud
	if(!(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
	{
		int GameFlags = m_pClient->m_GameInfo.m_GameFlags;
		float Whole = 300*Graphics()->ScreenAspect();
		float StartY = 229.0f;
		const float TeamOffset = 20.0f;

		if(GameFlags&GAMEFLAG_TEAMS && m_pClient->m_Snap.m_pGameDataTeam && !(GameFlags&GAMEFLAG_RACE))
		{
			static float s_ExpectedScoreWidth = TextRender()->TextWidth(14.0f, "100", -1);
			static CTextCursor s_TeamscoreCursors[2];
			static CTextCursor s_PlayerCountCursors[2];
		
			char aScoreTeam[2][32];
			int Teamscores[2];
			Teamscores[0] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreRed;
			Teamscores[1] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreBlue;
			str_format(aScoreTeam[TEAM_RED], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_RED]);
			str_format(aScoreTeam[TEAM_BLUE], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_BLUE]);
			
			for(int t = 0; t < NUM_TEAMS; t++)
			{
				s_TeamscoreCursors[t].m_FontSize = 14.0f;
				s_TeamscoreCursors[t].Reset(Teamscores[t]);
				TextRender()->TextDeferred(&s_TeamscoreCursors[t], aScoreTeam[t], -1);
			}

			float ScoreWidthMax = maximum(maximum(s_TeamscoreCursors[0].Width(), s_TeamscoreCursors[1].Width()), s_ExpectedScoreWidth);
			float Split = 3.0f;
			float ImageSize = GameFlags&GAMEFLAG_FLAGS ? 16.0f : Split;

			for(int t = 0; t < NUM_TEAMS; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == 0 ? vec4(1.0f, 0.0f, 0.0f, 0.25f) : vec4(0.0f, 0.0f, 1.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				s_TeamscoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_TeamscoreCursors[t].Width())/2-Split, StartY+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_TeamscoreCursors[t]);

				if(GameFlags&GAMEFLAG_SURVIVAL)
				{
					s_PlayerCountCursors[t].m_FontSize = 8.0f;
					char aBuf[32];
					str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[t]==1 ? Localize("%d player left") : Localize("%d players left"),
								m_pClient->m_Snap.m_AliveCount[t]);

					s_PlayerCountCursors[t].Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[t]);
					TextRender()->TextDeferred(&s_PlayerCountCursors[t], aBuf, -1);
					s_PlayerCountCursors[t].MoveTo(minimum(Whole-s_PlayerCountCursors[t].Width()-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split), StartY+(t+1)*TeamOffset-3.0f);
					TextRender()->DrawTextOutlined(&s_PlayerCountCursors[t]);
				}
				StartY += 8.0f;
			}

			if(GameFlags&GAMEFLAG_FLAGS && m_pClient->m_Snap.m_pGameDataFlag)
			{
				int FlagCarrier[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue };
				int FlagDropTick[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickBlue };
				StartY = 229.0f;

				for(int t = 0; t < 2; t++)
				{
					int BlinkTimer = (FlagDropTick[t] != 0 && (Client()->GameTick()-FlagDropTick[t])/Client()->GameTickSpeed() >= 25) ? 10 : 20;
					if(FlagCarrier[t] == FLAG_ATSTAND || (FlagCarrier[t] == FLAG_TAKEN && ((Client()->GameTick()/BlinkTimer)&1)))
					{
						// draw flag
						Graphics()->BlendNormal();
						Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
						Graphics()->QuadsBegin();
						RenderTools()->SelectSprite(t==0?SPRITE_FLAG_RED:SPRITE_FLAG_BLUE);
						IGraphics::CQuadItem QuadItem(Whole-ScoreWidthMax-ImageSize, StartY+1.0f+t*TeamOffset, ImageSize/2, ImageSize);
						Graphics()->QuadsDrawTL(&QuadItem, 1);
						Graphics()->QuadsEnd();
					}
					else if(FlagCarrier[t] >= 0)
					{
						// draw name
						static CTextCursor s_CarrierCursor(8.0f);
						s_CarrierCursor.Reset();

						int ID = FlagCarrier[t]%MAX_CLIENTS;
						char aName[64];
						str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

						TextRender()->TextDeferred(&s_CarrierCursor, aName, -1);

						float w = s_CarrierCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
						float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split);
						float y = StartY+(t+1)*TeamOffset-3.0f;
						
						float AdvanceID = UI()->DrawClientID(s_CarrierCursor.m_FontSize, vec2(x, y), ID);
						s_CarrierCursor.MoveTo(x + AdvanceID, y);
						TextRender()->DrawTextOutlined(&s_CarrierCursor);

						// draw tee of the flag holder
						CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
						Info.m_Size = 18.0f;
						RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
							vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
					}
					StartY += 8.0f;
				}
			}
		}
		else
		{
			int Local = -1;
			int aPos[2] = { 1, 2 };
			CGameClient::CPlayerInfoItem aPlayerInfo[2] = {{0}};
			int i = 0;
			for(int t = 0; t < 2 && i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
			{
				if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
				{
					aPlayerInfo[t] = m_pClient->m_Snap.m_aInfoByScore[i];
					if(aPlayerInfo[t].m_ClientID == m_pClient->m_LocalClientID)
						Local = t;
					++t;
				}
			}
			// search local player info if not a spectator, nor within top2 scores
			if(Local == -1 && m_pClient->m_LocalClientID != -1 && m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team != TEAM_SPECTATORS)
			{
				for(; i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
				{
					if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
						++aPos[1];
					if(m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID == m_pClient->m_LocalClientID)
					{
						aPlayerInfo[1] = m_pClient->m_Snap.m_aInfoByScore[i];
						Local = 1;
						break;
					}
				}
			}

			float FontSize = (GameFlags&GAMEFLAG_RACE) ? 10.f : 14.f;
			static CTextCursor s_ScoreCursors[2];
			static CTextCursor s_PositionCursors[2];
			char aBuf[32];
			for(int t = 0; t < 2; ++t)
			{
				s_ScoreCursors[t].m_FontSize = FontSize;
				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					if(GameFlags&GAMEFLAG_RACE)
						FormatTime(aBuf, sizeof(aBuf), aPlayerInfo[t].m_pPlayerInfo->m_Score, m_pClient->RacePrecision());
					else
						str_format(aBuf, sizeof(aBuf), "%d", aPlayerInfo[t].m_pPlayerInfo->m_Score);
					s_ScoreCursors[t].Reset(aPlayerInfo[t].m_pPlayerInfo->m_Score);
				}
				else
				{
					aBuf[0] = 0;
					s_ScoreCursors[t].Reset();
				}

				TextRender()->TextDeferred(&s_ScoreCursors[t], aBuf, -1);

				s_PositionCursors[t].Reset(0);
				str_format(aBuf, sizeof(aBuf), "%d.", aPos[t]);
				s_PositionCursors[t].m_FontSize = 10.0f;
				TextRender()->TextDeferred(&s_PositionCursors[t], aBuf, -1);
			}

			float ScoreWidthMax = maximum(maximum(s_ScoreCursors[0].Width(), s_ScoreCursors[1].Width()), TextRender()->TextWidth(FontSize, "10", -1));
			float Split = 3.0f, ImageSize = 16.0f, PosSize = 16.0f;

			if(GameFlags&GAMEFLAG_SURVIVAL)
			{
				// draw number of alive players
				static CTextCursor s_PlayerCountCursor(8.0f);
				char aBuf[32];
				str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[0] == 1 ? Localize("%d player left") : Localize("%d players left"),
					m_pClient->m_Snap.m_AliveCount[0]);
				s_PlayerCountCursor.Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[0]);
				TextRender()->TextDeferred(&s_PlayerCountCursor, aBuf, -1);
				float w = s_PlayerCountCursor.Width();
				s_PlayerCountCursor.MoveTo(minimum(Whole - w - 1.0f, Whole - ScoreWidthMax - ImageSize - 2 * Split), StartY - 12.0f);
				TextRender()->DrawTextOutlined(&s_PlayerCountCursor);
			}

			for(int t = 0; t < 2; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split-PosSize, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split+PosSize, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == Local ? vec4(1.0f, 1.0f, 1.0f, 0.25f) : vec4(0.0f, 0.0f, 0.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				float Spacing = (GameFlags&GAMEFLAG_RACE) ? 2.f : 0.f;
				s_ScoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_ScoreCursors[t].Width())/2-Split, StartY+t*TeamOffset+Spacing);
				TextRender()->DrawTextOutlined(&s_ScoreCursors[t]);

				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					// draw name
					static CTextCursor s_NameCursor(8.0f);
					s_NameCursor.Reset();

					int ID = aPlayerInfo[t].m_ClientID;
					char aName[64];
					str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

					TextRender()->TextDeferred(&s_NameCursor, aName, -1);

					float w = s_NameCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
					float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split-PosSize);
					float y = StartY+(t+1)*TeamOffset-3.0f;

					float AdvanceID = UI()->DrawClientID(s_NameCursor.m_FontSize, vec2(x, y), ID);
					s_NameCursor.MoveTo(x + AdvanceID, y);
					TextRender()->DrawTextOutlined(&s_NameCursor);

					// draw tee
					CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
					Info.m_Size = 18.0f;
					RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
						vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
				}

				// draw position
				s_PositionCursors[t].MoveTo(Whole-ScoreWidthMax-ImageSize-Split-PosSize, StartY+2.0f+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_PositionCursors[t]);

				StartY += 8.0f;
			}
		}
	}
}